

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

void __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::AppendSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,SegmentLock *l,
          unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *segment)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_20;
  
  LoadAllSegments(this,l);
  local_20._M_head_impl =
       (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
       super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
       super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
  (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
  AppendSegmentInternal
            (this,l,(unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                    &local_20);
  ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_20);
  return;
}

Assistant:

void AppendSegment(SegmentLock &l, unique_ptr<T> segment) {
		LoadAllSegments(l);
		AppendSegmentInternal(l, std::move(segment));
	}